

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupMarked(Gia_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  uint *puVar7;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Gia_Rpr_t *pGVar12;
  int *piVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  int local_58;
  int local_54;
  
  if ((long)p->nObjs < 1) {
LAB_0067aa06:
    iVar18 = 0;
  }
  else {
    lVar16 = 0;
    iVar18 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_0067aa06;
      iVar18 = iVar18 + (uint)((*(uint *)(&p->pObjs->field_0x0 + lVar16) >> 0x1e & 1) != 0);
      lVar16 = lVar16 + 0xc;
    } while ((long)p->nObjs * 0xc != lVar16);
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs - iVar18);
  if (p->pMuxes != (uint *)0x0) {
    puVar7 = (uint *)calloc((long)p_00->nObjsAlloc,4);
    p_00->pMuxes = puVar7;
  }
  p_00->nConstrs = p->nConstrs;
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  uVar17 = (ulong)(uint)p->nObjs;
  if (p->nObjs < 2) {
    local_54 = 0;
    if (p_00->nObjsAlloc != p_00->nObjs) goto LAB_0067b6b9;
  }
  else {
    local_58 = 0;
    lVar26 = 1;
    lVar16 = 0x14;
    local_54 = 0;
    do {
      pGVar3 = p->pObjs;
      uVar25 = *(ulong *)((long)pGVar3 + lVar16 + -8);
      uVar19 = (uint)uVar25;
      uVar20 = uVar19 & 0x1fffffff;
      uVar24 = (uint)(uVar25 >> 0x20);
      uVar22 = uVar24 & 0x1fffffff;
      if ((uVar19 >> 0x1e & 1) == 0) {
        uVar6 = uVar19 & 0x1fffffff;
        if ((((int)uVar19 < 0) || (uVar20 == 0x1fffffff)) || (uVar20 != uVar22)) {
          if (uVar6 == 0x1fffffff || (int)uVar19 < 0) {
            if ((uVar19 & 0x9fffffff) == 0x9fffffff) {
              pGVar11 = Gia_ManAppendObj(p_00);
              uVar17 = *(ulong *)pGVar11;
              *(ulong *)pGVar11 = uVar17 | 0x9fffffff;
              *(ulong *)pGVar11 =
                   uVar17 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar10 = p_00->pObjs;
              if ((pGVar11 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar11)) {
LAB_0067b564:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              Vec_IntPush(p_00->vCis,
                          (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * -0x55555555);
              pGVar10 = p_00->pObjs;
              if ((pGVar11 < pGVar10) || (pGVar10 + p_00->nObjs <= pGVar11)) goto LAB_0067b564;
              *(int *)(&pGVar3->field_0x0 + lVar16) =
                   (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * 0x55555556;
              uVar4 = *(undefined8 *)((long)pGVar3 + lVar16 + -8);
              uVar24 = 0;
              if (((uint)uVar4 & 0x9fffffff) == 0x9fffffff) {
                uVar24 = (uint)(p->vCis->nSize - p->nRegs <=
                               (int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff));
              }
              local_54 = local_54 + uVar24;
            }
            else if ((int)uVar19 < 0 && uVar6 != 0x1fffffff) {
              uVar24 = *(uint *)((long)pGVar3 + lVar16 + (ulong)(uVar6 << 2) * -3);
              if ((int)uVar24 < 0) goto LAB_0067b583;
              iVar18 = Gia_ManAppendCo(p_00,uVar24 ^ uVar19 >> 0x1d & 1);
              *(int *)(&pGVar3->field_0x0 + lVar16) = iVar18;
              uVar4 = *(undefined8 *)((long)pGVar3 + lVar16 + -8);
              uVar24 = (uint)uVar4;
              uVar20 = 0;
              if ((~uVar24 & 0x1fffffff) != 0 && (int)uVar24 < 0) {
                uVar20 = (uint)(p->vCos->nSize - p->nRegs <=
                               (int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff));
              }
              local_58 = local_58 + uVar20;
            }
          }
          else if (uVar20 < uVar22) {
            uVar20 = *(uint *)((long)pGVar3 + lVar16 + (ulong)(uVar6 << 2) * -3);
            if (((int)uVar20 < 0) ||
               (uVar22 = *(uint *)((long)pGVar3 + lVar16 + (ulong)((uVar24 & 0x1fffffff) << 2) * -3)
               , (int)uVar22 < 0)) goto LAB_0067b583;
            pGVar10 = Gia_ManAppendObj(p_00);
            uVar6 = uVar20 >> 1;
            uVar19 = p_00->nObjs;
            if ((int)uVar19 <= (int)uVar6) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x296,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            uVar14 = uVar22 >> 1;
            if (uVar19 <= uVar14) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x297,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            if (uVar6 == uVar14) {
              __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x298,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            if (((uint)(uVar25 >> 0x1d) & 7) != (uVar20 & 1)) {
              __assert_fail("!Abc_LitIsCompl(iLit0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x299,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            if (((uVar22 ^ uVar24 >> 0x1d) & 1) != 0) {
              __assert_fail("!Abc_LitIsCompl(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x29a,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
            }
            pGVar11 = p_00->pObjs;
            iVar18 = (int)pGVar10;
            if (uVar14 < uVar6) {
              if (pGVar11 + uVar19 <= pGVar10 || pGVar10 < pGVar11) goto LAB_0067b564;
              uVar17 = *(ulong *)pGVar10 & 0xffffffffc0000000 |
                       (ulong)(((uint)(iVar18 - (int)pGVar11) >> 2) * -0x55555555 - uVar6 &
                              0x1fffffff);
              *(ulong *)pGVar10 = uVar17;
              pGVar11 = p_00->pObjs;
              if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_0067b564;
              uVar21 = (ulong)(((uint)(iVar18 - (int)pGVar11) >> 2) * -0x55555555 - uVar14 &
                              0x1fffffff) << 0x20;
              uVar25 = 0xe0000000dfffffff;
            }
            else {
              if (pGVar11 + uVar19 <= pGVar10 || pGVar10 < pGVar11) goto LAB_0067b564;
              uVar17 = *(ulong *)pGVar10 & 0xc0000000ffffffff |
                       (ulong)(((uint)(iVar18 - (int)pGVar11) >> 2) * -0x55555555 - uVar6 &
                              0x1fffffff) << 0x20;
              *(ulong *)pGVar10 = uVar17;
              pGVar11 = p_00->pObjs;
              if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_0067b564;
              uVar21 = (ulong)(((uint)(iVar18 - (int)pGVar11) >> 2) * -0x55555555 - uVar14 &
                              0x1fffffff);
              uVar25 = 0xdfffffffe0000000;
            }
            *(ulong *)pGVar10 = uVar17 & uVar25 & 0xdfffffffdfffffff | uVar21;
            p_00->nXors = p_00->nXors + 1;
            pGVar11 = p_00->pObjs;
            if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_0067b564;
            *(int *)(&pGVar3->field_0x0 + lVar16) =
                 (int)((ulong)((long)pGVar10 - (long)pGVar11) >> 2) * 0x55555556;
          }
          else {
            if ((p->pMuxes == (uint *)0x0) || (uVar20 = p->pMuxes[lVar26], uVar20 == 0)) {
              uVar20 = *(uint *)((long)pGVar3 + lVar16 + (ulong)(uVar6 << 2) * -3);
              if (((int)uVar20 < 0) ||
                 (uVar22 = *(uint *)((long)pGVar3 +
                                    lVar16 + (ulong)((uVar24 & 0x1fffffff) << 2) * -3),
                 (int)uVar22 < 0)) {
LAB_0067b583:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10f,"int Abc_LitNotCond(int, int)");
              }
              iVar18 = Gia_ManAppendAnd(p_00,uVar20 ^ (uint)(uVar25 >> 0x1d) & 7,
                                        uVar22 ^ uVar24 >> 0x1d & 1);
              goto LAB_0067ab4e;
            }
            if ((int)uVar20 < 0) goto LAB_0067b5c1;
            if ((uint)uVar17 <= uVar20 >> 1) goto LAB_0067b5e0;
            uVar22 = pGVar3[uVar20 >> 1].Value;
            if ((((int)uVar22 < 0) ||
                (uVar14 = *(uint *)((long)pGVar3 + lVar16 + (ulong)((uVar24 & 0x1fffffff) << 2) * -3
                                   ), (int)uVar14 < 0)) ||
               (uVar6 = *(uint *)((long)pGVar3 + lVar16 + (ulong)(uVar6 << 2) * -3), (int)uVar6 < 0)
               ) goto LAB_0067b583;
            pGVar10 = Gia_ManAppendObj(p_00);
            if (p_00->pMuxes == (uint *)0x0) {
              __assert_fail("p->pMuxes != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2af,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar15 = uVar6 >> 1;
            uVar1 = p_00->nObjs;
            if ((int)uVar1 <= (int)uVar15) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b0,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar5 = uVar14 >> 1;
            if (uVar1 <= uVar5) {
              __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b1,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar23 = uVar22 >> 1;
            if (uVar1 <= uVar23) {
              __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b2,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            if (uVar15 == uVar5) {
              __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b3,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            if (uVar23 == uVar15) {
              __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b4,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            if (uVar23 == uVar5) {
              __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar24 = (uVar14 ^ uVar24 >> 0x1d) & 1;
            if ((uVar24 != 0) && (p_00->pHTable != (int *)0x0)) {
              __assert_fail("!p->pHTable || !Abc_LitIsCompl(iLit1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x2b6,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
            }
            uVar22 = uVar22 ^ uVar20 & 1;
            uVar6 = uVar6 ^ uVar19 >> 0x1d;
            pGVar11 = p_00->pObjs;
            iVar18 = (int)pGVar10;
            if (uVar15 < uVar5) {
              if (pGVar11 + uVar1 <= pGVar10 || pGVar10 < pGVar11) goto LAB_0067b564;
              uVar17 = *(ulong *)pGVar10;
              uVar25 = (ulong)((uVar6 & 1) << 0x1d |
                              ((uint)(iVar18 - (int)pGVar11) >> 2) * -0x55555555 - uVar15 &
                              0x1fffffff);
              *(ulong *)pGVar10 = uVar25 | uVar17 & 0xffffffffc0000000;
              pGVar11 = p_00->pObjs;
              if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_0067b564;
              *(ulong *)pGVar10 =
                   (ulong)uVar24 << 0x3d |
                   (ulong)(((uint)(iVar18 - (int)pGVar11) >> 2) * -0x55555555 - uVar5 & 0x1fffffff)
                   << 0x20 | uVar25 | uVar17 & 0xc0000000c0000000;
              pGVar11 = p_00->pObjs;
              if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_0067b564;
            }
            else {
              if (pGVar11 + uVar1 <= pGVar10 || pGVar10 < pGVar11) goto LAB_0067b564;
              uVar25 = (ulong)(((uint)(iVar18 - (int)pGVar11) >> 2) * -0x55555555 - uVar15 &
                              0x1fffffff) << 0x20;
              uVar17 = *(ulong *)pGVar10;
              uVar21 = (ulong)(uVar6 & 1) << 0x3d;
              *(ulong *)pGVar10 = uVar21 | uVar17 & 0xc0000000ffffffff | uVar25;
              pGVar11 = p_00->pObjs;
              if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_0067b564;
              *(ulong *)pGVar10 =
                   (ulong)(uVar24 << 0x1d) | uVar21 | uVar17 & 0xc0000000c0000000 | uVar25 |
                   (ulong)(((uint)(iVar18 - (int)pGVar11) >> 2) * -0x55555555 - uVar5 & 0x1fffffff);
              pGVar11 = p_00->pObjs;
              if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_0067b564;
              uVar22 = uVar22 ^ 1;
            }
            iVar18 = (int)((ulong)((long)pGVar10 - (long)pGVar11) >> 2);
            p_00->pMuxes[iVar18 * -0x55555555] = uVar22;
            p_00->nMuxes = p_00->nMuxes + 1;
            if (pGVar11 + p_00->nObjs <= pGVar10) goto LAB_0067b564;
            *(int *)(&pGVar3->field_0x0 + lVar16) = iVar18 * 0x55555556;
          }
        }
        else {
          uVar24 = *(uint *)((long)pGVar3 + lVar16 + (ulong)(uVar6 << 2) * -3);
          if ((int)uVar24 < 0) goto LAB_0067b583;
          iVar18 = Gia_ManAppendBuf(p_00,uVar24 ^ uVar19 >> 0x1d);
LAB_0067ab4e:
          *(int *)(&pGVar3->field_0x0 + lVar16) = iVar18;
        }
      }
      else {
        if (((-1 < (int)uVar19) && (uVar20 != 0x1fffffff)) && (uVar20 == uVar22)) {
          __assert_fail("!Gia_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                        ,0x42b,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
        }
        *(ulong *)((long)pGVar3 + lVar16 + -8) = uVar25 & 0xffffffffbfffffff;
      }
      lVar26 = lVar26 + 1;
      uVar17 = (ulong)p->nObjs;
      lVar16 = lVar16 + 0xc;
    } while (lVar26 < (long)uVar17);
    if (p_00->nObjsAlloc != p_00->nObjs) {
LAB_0067b6b9:
      __assert_fail("pNew->nObjsAlloc == pNew->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                    ,0x446,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
    }
    if (local_54 != local_58) {
      __assert_fail("nRos == nRis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                    ,0x447,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
    }
  }
  Gia_ManSetRegNum(p_00,local_54);
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    pGVar12 = (Gia_Rpr_t *)calloc((long)p_00->nObjs,4);
    p_00->pReprs = pGVar12;
    if (0 < p->nObjs) {
      lVar16 = 0;
      do {
        p_00->pReprs[lVar16] = (Gia_Rpr_t)((uint)p_00->pReprs[lVar16] | 0xfffffff);
        lVar16 = lVar16 + 1;
        uVar17 = (ulong)p->nObjs;
      } while (lVar16 < (long)uVar17);
      if (1 < p->nObjs) {
        lVar16 = 1;
        lVar26 = 5;
        do {
          pGVar3 = p->pObjs;
          uVar24 = *(uint *)(&pGVar3->field_0x0 + lVar26 * 4);
          if ((uVar24 != 0xffffffff) &&
             (uVar25 = (ulong)(uint)p->pReprs[lVar16] & 0xfffffff, uVar25 != 0xfffffff)) {
            if ((uint)uVar17 <= (uint)uVar25) goto LAB_0067b5e0;
            uVar20 = pGVar3[uVar25].Value;
            if (uVar20 != 0xffffffff) {
              uVar4 = *(undefined8 *)((long)pGVar3 + lVar26 * 4 + -8);
              uVar22 = (uint)uVar4;
              if (((-1 < (int)uVar22) && (uVar22 = uVar22 & 0x1fffffff, uVar22 != 0x1fffffff)) &&
                 (uVar22 == ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff))) {
                __assert_fail("!Gia_ObjIsBuf(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                              ,0x458,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
              }
              if (((int)uVar24 < 0) || ((int)uVar20 < 0)) goto LAB_0067b5c1;
              uVar24 = uVar24 >> 1;
              uVar20 = uVar20 >> 1;
              if (uVar24 != uVar20) {
                if ((uVar20 != 0xfffffff) && (uVar24 <= uVar20)) {
                  __assert_fail("Num == GIA_VOID || Num < Id",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                                ,0x38c,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
                }
                p_00->pReprs[uVar24] =
                     (Gia_Rpr_t)((uint)p_00->pReprs[uVar24] & 0xf0000000 | uVar20 & 0xfffffff);
                uVar17 = (ulong)(uint)p->nObjs;
              }
            }
          }
          lVar16 = lVar16 + 1;
          lVar26 = lVar26 + 3;
        } while (lVar16 < (int)uVar17);
      }
    }
    piVar13 = Gia_ManDeriveNexts(p_00);
    p_00->pNexts = piVar13;
  }
  if (p->pSibls != (int *)0x0) {
    piVar13 = (int *)calloc((long)p_00->nObjs,4);
    p_00->pSibls = piVar13;
    uVar24 = p->nObjs;
    if (1 < (long)(int)uVar24) {
      pGVar3 = p->pObjs;
      puVar7 = &pGVar3[1].Value;
      lVar16 = 1;
      do {
        uVar20 = *puVar7;
        if ((uVar20 != 0xffffffff) && (p->pSibls != (int *)0x0)) {
          uVar22 = p->pSibls[lVar16];
          if ((ulong)uVar22 != 0) {
            if (((int)uVar22 < 0) || (uVar24 <= uVar22)) {
LAB_0067b5e0:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar22 = pGVar3[uVar22].Value;
            if (uVar22 != 0xffffffff) {
              uVar19 = (uint)*(undefined8 *)(puVar7 + -2);
              if (((-1 < (int)uVar19) && (uVar19 = uVar19 & 0x1fffffff, uVar19 != 0x1fffffff)) &&
                 (uVar19 == ((uint)((ulong)*(undefined8 *)(puVar7 + -2) >> 0x20) & 0x1fffffff))) {
                __assert_fail("!Gia_ObjIsBuf(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                              ,0x46b,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
              }
              if (((int)uVar20 < 0) || ((int)uVar22 < 0)) {
LAB_0067b5c1:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10c,"int Abc_Lit2Var(int)");
              }
              if (uVar20 >> 1 <= uVar22 >> 1) {
                __assert_fail("Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pSibl->Value)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                              ,0x46c,"Gia_Man_t *Gia_ManDupMarked(Gia_Man_t *)");
              }
              piVar13[uVar20 >> 1] = uVar22 >> 1;
            }
          }
        }
        lVar16 = lVar16 + 1;
        puVar7 = puVar7 + 3;
      } while ((int)uVar24 != lVar16);
    }
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupMarked( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nRos = 0, nRis = 0;
    int CountMarked = 0;
    Gia_ManForEachObj( p, pObj, i )
        CountMarked += pObj->fMark0;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) - CountMarked );
    if ( p->pMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->nConstrs = p->nConstrs;
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( pObj->fMark0 )
        {
            assert( !Gia_ObjIsBuf(pObj) );
            pObj->fMark0 = 0;
            continue;
        }
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Gia_ObjIsXor(pObj) )
                pObj->Value = Gia_ManAppendXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            else if ( Gia_ObjIsMux(p, pObj) )
                pObj->Value = Gia_ManAppendMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
            else
                pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            nRos += Gia_ObjIsRo(p, pObj);
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
//            Gia_Obj_t * pFanin = Gia_ObjFanin0(pObj);
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
            nRis += Gia_ObjIsRi(p, pObj);
        }
    }
    assert( pNew->nObjsAlloc == pNew->nObjs );
    assert( nRos == nRis );
    Gia_ManSetRegNum( pNew, nRos );
    if ( p->pReprs && p->pNexts )
    {
        Gia_Obj_t * pRepr;
        pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(pNew) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( pNew, i, GIA_VOID );
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            pRepr = Gia_ObjReprObj( p, i );
            if ( pRepr == NULL )
                continue;
            if ( !~pRepr->Value )
                continue;
            assert( !Gia_ObjIsBuf(pObj) );
            if ( Abc_Lit2Var(pObj->Value) != Abc_Lit2Var(pRepr->Value) )
                Gia_ObjSetRepr( pNew, Abc_Lit2Var(pObj->Value), Abc_Lit2Var(pRepr->Value) ); 
        }
        pNew->pNexts = Gia_ManDeriveNexts( pNew );
    }
    if ( Gia_ManHasChoices(p) )
    {
        Gia_Obj_t * pSibl;
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(pNew) );
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            pSibl = Gia_ObjSiblObj( p, i );
            if ( pSibl == NULL )
                continue;
            if ( !~pSibl->Value )
                continue;
            assert( !Gia_ObjIsBuf(pObj) );
            assert( Abc_Lit2Var(pObj->Value) > Abc_Lit2Var(pSibl->Value) );
            pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(pSibl->Value);
        }
    }
    return pNew;
}